

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isBilinearRangeValid
               (LookupPrecision *prec,ColorQuad *quad,Vec2 *xBounds,Vec2 *yBounds,float searchStep,
               Vec4 *result)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  Vec4 *in_R9;
  uint uVar9;
  uint uVar10;
  int iVar11;
  float fVar12;
  undefined1 in_register_00001204 [12];
  float fVar13;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  float fVar14;
  float in_XMM4_Da;
  float fVar15;
  Vector<bool,_4> res;
  Vec4 c1;
  undefined1 local_b8 [44];
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  int iStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Vec4 local_38;
  
  uStack_44 = in_register_00001204._0_4_;
  uStack_40 = in_register_00001204._4_4_;
  uStack_3c = in_register_00001204._8_4_;
  fVar12 = (quad->p00).m_data[0];
  fVar13 = (quad->p01).m_data[0];
  fVar4 = (quad->p10).m_data[0];
  fVar5 = (quad->p11).m_data[0];
  fVar14 = (float)(~-(uint)(fVar13 <= fVar5) & (uint)fVar5 | (uint)fVar13 & -(uint)(fVar13 <= fVar5)
                  );
  uVar9 = -(uint)(fVar4 <= fVar14);
  fVar15 = (float)(~uVar9 & (uint)fVar14 | (uint)fVar4 & uVar9);
  uVar9 = -(uint)(fVar12 <= fVar15);
  fVar14 = (prec->colorThreshold).m_data[0];
  fVar13 = (float)(~-(uint)(fVar5 <= fVar13) & (uint)fVar5 | (uint)fVar13 & -(uint)(fVar5 <= fVar13)
                  );
  uVar10 = -(uint)(fVar13 <= fVar4);
  fVar13 = (float)(~uVar10 & (uint)fVar13 | (uint)fVar4 & uVar10);
  uVar10 = -(uint)(fVar13 <= fVar12);
  iVar11 = -(uint)(xBounds->m_data[0] <=
                   (float)(~uVar10 & (uint)fVar13 | (uint)fVar12 & uVar10) + fVar14 &&
                  (float)(~uVar9 & (uint)fVar15 | (uint)fVar12 & uVar9) - fVar14 <=
                  xBounds->m_data[0]);
  uVar3 = -(short)(iVar11 >> 0x1f);
  bVar2 = (uVar3 != 0) * (uVar3 < 0x100) * -(char)(iVar11 >> 0x1f) - (0xff < uVar3);
  if ((prec->colorMask).m_data[0] != true ||
      (bool)((bVar2 != 0) * (bVar2 < 0x100) * bVar2) != 0xff < bVar2) {
    uVar8 = 0xffffffffffffffff;
    do {
      if (uVar8 == 2) goto LAB_0090558d;
      uVar1 = uVar8 + 1;
      lVar6 = uVar8 + 2;
      uVar8 = uVar1;
    } while (local_b8[lVar6] != '\0');
    if (2 < uVar1) {
LAB_0090558d:
      local_b8._16_4_ = (undefined4)in_XMM1_Qa;
      local_b8._20_4_ = SUB84(in_XMM1_Qa,4);
      local_b8._24_4_ = (undefined4)in_XMM1_Qb;
      local_b8._28_4_ = (undefined4)((ulong)in_XMM1_Qb >> 0x20);
      local_58 = (float)local_b8._16_4_ + in_XMM4_Da;
      iStack_54 = local_b8._20_4_;
      fStack_50 = (float)local_b8._24_4_;
      fStack_4c = (float)local_b8._28_4_;
      if (searchStep < local_58) {
        local_68 = *(undefined8 *)(quad->p00).m_data;
        uStack_60 = *(undefined8 *)((quad->p00).m_data + 2);
        local_78 = *(undefined8 *)(quad->p01).m_data;
        uStack_70 = *(undefined8 *)((quad->p01).m_data + 2);
        local_88 = *(undefined8 *)(quad->p10).m_data;
        uStack_80 = *(undefined8 *)((quad->p10).m_data + 2);
        local_b8._32_8_ = *(undefined8 *)(quad->p11).m_data;
        unique0x10000458 = *(undefined8 *)((quad->p11).m_data + 2);
        local_b8._16_8_ = in_XMM1_Qa;
        do {
          fVar12 = (float)(~-(uint)(searchStep <= (float)local_b8._16_4_) & local_b8._16_4_ |
                          -(uint)(searchStep <= (float)local_b8._16_4_) & (uint)searchStep);
          fVar13 = 1.0 - fVar12;
          local_b8._0_4_ = fVar12 * (float)local_88 + fVar13 * (float)local_68;
          local_b8._4_4_ = fVar12 * local_88._4_4_ + fVar13 * local_68._4_4_;
          local_b8._8_4_ = fVar12 * (float)uStack_80 + fVar13 * (float)uStack_60;
          local_b8._12_4_ = fVar12 * uStack_80._4_4_ + fVar13 * uStack_60._4_4_;
          local_38.m_data[0] = fVar12 * (float)local_b8._32_4_ + fVar13 * (float)local_78;
          local_38.m_data[1] = fVar12 * (float)local_b8._36_4_ + fVar13 * local_78._4_4_;
          local_38.m_data[2] = fVar12 * (float)local_b8._40_4_ + fVar13 * (float)uStack_70;
          local_38.m_data[3] = fVar12 * fStack_8c + fVar13 * uStack_70._4_4_;
          local_48 = searchStep;
          bVar7 = isLinearRangeValid((tcu *)prec,(LookupPrecision *)local_b8,&local_38,
                                     (Vec4 *)xBounds,(Vec2 *)result,in_R9);
          if (bVar7) {
            return bVar7;
          }
          searchStep = local_48 + in_XMM4_Da;
        } while (searchStep < local_58);
        return bVar7;
      }
    }
  }
  return false;
}

Assistant:

static bool isBilinearRangeValid (const LookupPrecision&	prec,
								  const ColorQuad&			quad,
								  const Vec2&				xBounds,
								  const Vec2&				yBounds,
								  const float				searchStep,
								  const Vec4&				result)
{
	DE_ASSERT(xBounds.x() <= xBounds.y());
	DE_ASSERT(yBounds.x() <= yBounds.y());
	DE_ASSERT(xBounds.x() + searchStep > xBounds.x()); // step is not effectively 0
	DE_ASSERT(xBounds.y() + searchStep > xBounds.y());

	if (!isInColorBounds(prec, quad, result))
		return false;

	for (float x = xBounds.x(); x < xBounds.y()+searchStep; x += searchStep)
	{
		const float		a	= de::min(x, xBounds.y());
		const Vec4		c0	= quad.p00*(1.0f - a) + quad.p10*a;
		const Vec4		c1	= quad.p01*(1.0f - a) + quad.p11*a;

		if (isLinearRangeValid(prec, c0, c1, yBounds, result))
			return true;
	}

	return false;
}